

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_GetImageOffsetTest_ImageOffsetArrayFace_Test::TestBody
          (ktxTexture_GetImageOffsetTest_ImageOffsetArrayFace_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t levelRowBytes;
  ktx_uint32_t levelImageSize;
  ktx_uint32_t levelHeight;
  ktx_uint32_t levelWidth;
  ktx_uint32_t layerSize;
  ktx_uint32_t imageSize;
  ktx_uint32_t rowRounding;
  ktx_uint32_t rowBytes;
  ktx_size_t offset;
  ktx_size_t expectedOffset;
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffdc8) [28];
  AssertionResult *in_stack_fffffffffffffdd0;
  ktx_error_code_e *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  uint uVar4;
  int in_stack_fffffffffffffdec;
  uint line;
  char *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Type type;
  AssertHelper *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe30;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  AssertionResult *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe54;
  AssertionResult local_1a8 [2];
  AssertionResult local_188 [2];
  undefined4 local_168;
  undefined4 local_164;
  AssertionResult local_160 [2];
  AssertionResult local_140 [2];
  undefined4 local_120;
  undefined4 local_11c;
  AssertionResult local_118;
  uint local_104;
  string local_100 [40];
  undefined8 local_d8;
  undefined1 local_c1;
  AssertionResult local_c0 [3];
  undefined4 local_8c;
  AssertionResult local_88;
  int local_78;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined1 local_58 [8];
  ulong local_50;
  undefined4 local_44;
  undefined4 local_40 [4];
  uint local_30;
  uint local_2c;
  undefined4 local_20;
  int local_1c;
  undefined4 local_18;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_10[0] = 0;
  TestCreateInfo::TestCreateInfo((TestCreateInfo *)0x147628);
  local_40[0] = 0x8051;
  local_30 = 9;
  local_2c = 9;
  local_20 = 4;
  local_1c = 3;
  local_18 = 6;
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_8c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (ktx_error_code_e *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    testing::AssertionResult::failure_message((AssertionResult *)0x1476fd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
               in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (Message *)in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
    testing::Message::~Message((Message *)0x14775a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1477c8);
  local_c1 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdd0,(bool *)in_stack_fffffffffffffdc8,(type *)0x1477f6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    testing::Message::operator<<((Message *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_d8 = ktxErrorString(local_44);
    in_stack_fffffffffffffe00 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffdd0,(char **)in_stack_fffffffffffffdc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               (char *)in_stack_fffffffffffffe38._M_head_impl,in_stack_fffffffffffffe30);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
               in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (Message *)in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0x14791a);
  }
  local_104 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1479c7);
  if (local_104 == 0) {
    local_5c = 0x1b;
    local_60 = 1;
    local_64 = local_2c * 0x1c;
    local_68 = local_64 * *(int *)(local_10[0] + 0x3c);
    local_50 = (ulong)(uint)(local_68 * local_1c);
    local_11c = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,0,0,local_58);
    local_120 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (ktx_error_code_e *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x147b00);
      type = (Type)((ulong)pcVar3 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x147b5d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x147bcb);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,(unsigned_long *)in_stack_fffffffffffffdd8,
               (unsigned_long *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdf0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x147c3c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x147c99);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x147d0a);
    if (local_30 >> 1 == 0) {
      line = 1;
    }
    else {
      line = local_30 >> 1;
    }
    if (local_2c >> 1 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = local_2c >> 1;
    }
    local_60 = 3 - (line * 3 + 3 & 3);
    local_78 = local_60 + line * 3;
    local_74 = local_78 * uVar4;
    local_50 = (uint)(local_74 * *(int *)(local_10[0] + 0x3c) * 2) + local_50;
    local_70 = uVar4;
    local_6c = line;
    local_164 = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,2,0,local_58);
    local_168 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(line,uVar4),in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (ktx_error_code_e *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffde0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x147ea4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,line,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x147f01);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x147f6f);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(line,uVar4),in_stack_fffffffffffffde0,
               (unsigned_long *)in_stack_fffffffffffffdd8,(unsigned_long *)in_stack_fffffffffffffdd0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdd8 =
           (ktx_error_code_e *)
           testing::AssertionResult::failure_message((AssertionResult *)0x147fe0);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,line,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x14803d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1480ae);
    local_50 = (uint)(local_74 * 3) + local_50;
    uVar2 = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,2,3,local_58);
    uVar5 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)CONCAT44(line,uVar4),in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (ktx_error_code_e *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdd0 =
           (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0x14817c)
      ;
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,line,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar2,uVar5),(Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x1481d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14823b);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)CONCAT44(line,uVar4),in_stack_fffffffffffffde0,
               (unsigned_long *)in_stack_fffffffffffffdd8,(unsigned_long *)in_stack_fffffffffffffdd0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::AssertionResult::failure_message((AssertionResult *)0x1482a0);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,line,
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar2,uVar5),(Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x1482ec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14834e);
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_GetImageOffsetTest, ImageOffsetArrayFace) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    ktx_size_t expectedOffset, offset;
    ktx_uint32_t rowBytes, rowRounding, imageSize, layerSize;
    ktx_uint32_t levelWidth, levelHeight, levelImageSize, levelRowBytes;

    createInfo.glInternalformat = GL_RGB8;
    createInfo.baseWidth = 9;
    createInfo.baseWidth = 9;
    createInfo.baseHeight = 9;
    createInfo.numLevels = 4;
    createInfo.numLayers = 3;
    createInfo.numFaces = 6;
    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    rowBytes = 9 * 3;
    rowRounding = ROUNDING(rowBytes);
    imageSize = (rowBytes + rowRounding) * createInfo.baseHeight;
    layerSize = imageSize * texture->numFaces;
    expectedOffset = layerSize * createInfo.numLayers;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    levelWidth = MAX(1, createInfo.baseWidth >> 1);
    levelHeight = MAX(1, createInfo.baseHeight >> 1);
    levelRowBytes = levelWidth * 3;
    rowRounding = ROUNDING(levelRowBytes);
    levelRowBytes += rowRounding;
    levelImageSize = levelRowBytes * levelHeight;
    expectedOffset += levelImageSize * texture->numFaces * 2;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 2, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    expectedOffset += levelImageSize * 3; // 3 faces
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 2, 3, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    if (texture)
        ktxTexture_Destroy(texture);
}